

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

char __thiscall
duckdb::Interpolator<true>::Operation<signed_char,signed_char,duckdb::QuantileDirect<signed_char>>
          (Interpolator<true> *this,char *v_t,Vector *result,QuantileDirect<signed_char> *accessor)

{
  RESULT_TYPE input;
  bool bVar1;
  InvalidInputException *this_00;
  char input_00;
  char result_1;
  char local_39;
  string local_38;
  
  input = InterpolateInternal<signed_char,duckdb::QuantileDirect<signed_char>>(this,v_t,accessor);
  bVar1 = TryCast::Operation<signed_char,signed_char>(input,&local_39,false);
  if (bVar1) {
    return local_39;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<signed_char,signed_char>(&local_38,(duckdb *)(ulong)(uint)(int)input,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}